

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tent_dist.hpp
# Opt level: O1

result_type_conflict1 __thiscall
trng::tent_dist<float>::cdf(tent_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = x - (this->P).m_;
  fVar1 = (this->P).d_;
  fVar3 = 0.0;
  if (-fVar1 < fVar2) {
    if (fVar2 <= 0.0) {
      fVar3 = ((fVar2 + fVar1) * (fVar2 + fVar1)) / ((fVar1 + fVar1) * fVar1);
    }
    else if (fVar1 <= fVar2) {
      fVar3 = 1.0;
    }
    else {
      fVar3 = 1.0 - ((fVar2 - fVar1) * (fVar2 - fVar1)) / ((fVar1 + fVar1) * fVar1);
    }
  }
  return fVar3;
}

Assistant:

cdf(result_type x) const {
      x -= P.m();
      if (x <= -P.d())
        return 0;
      if (x <= 0)
        return (x + P.d()) * (x + P.d()) / (result_type(2) * P.d() * P.d());
      if (x < P.d())
        return 1 - (x - P.d()) * (x - P.d()) / (result_type(2) * P.d() * P.d());
      return 1;
    }